

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
IntegerInstance::op_subtract
          (string *__return_storage_ptr__,IntegerInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  double dVar5;
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str != 0x20) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: wrong number of arguments.";
LAB_00143e95:
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  bVar1 = Grammar::is_integer_value(str);
  if (!bVar1) {
    bVar1 = Grammar::is_float_value
                      ((arguments->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = "RuntimeError: invalid argument.";
      goto LAB_00143e95;
    }
  }
  bVar1 = Grammar::is_integer_value
                    ((arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  pcVar4 = (((arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  if (bVar1) {
    iVar2 = atoi(pcVar4);
    dVar5 = (double)iVar2;
  }
  else {
    dVar5 = atof(pcVar4);
  }
  this->_value = (int)((double)this->_value - dVar5);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerInstance::op_subtract(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_integer_value(arguments[0]) && !Grammar::is_float_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    _value -= (Grammar::is_integer_value(arguments[0])) ? atoi(arguments[0].c_str()) : atof(arguments[0].c_str());
    return "null";
}